

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void spell_crush(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int idam;
  bool bVar1;
  int iVar2;
  
  iVar2 = dice(level,3);
  bVar1 = saves_spell(level,(CHAR_DATA *)vo,1);
  idam = (iVar2 - (iVar2 + 0x14 >> 0x1f)) + 0x14 >> 1;
  if (!bVar1) {
    idam = iVar2 + 0x14;
  }
  act("You concentrate and briefly disrupt the molecular structure of $N\'s organs!",ch,(void *)0x0,
      vo,3);
  act("$n extends a hand towards you and you feel a horrible rending pain deep within you!",ch,
      (void *)0x0,vo,2);
  act("$n extends a hand towards $N, who lurches in agony despite no visible injury!",ch,(void *)0x0
      ,vo,1);
  damage_new(ch,(CHAR_DATA *)vo,idam,sn,0x14,true,false,0,1,"crushing force");
  return;
}

Assistant:

void spell_crush(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam;

	dam = dice(level, 3) + 20;

	if (saves_spell(level, victim, DAM_BASH))
		dam /= 2;

	act("You concentrate and briefly disrupt the molecular structure of $N's organs!", ch, 0, victim, TO_CHAR);
	act("$n extends a hand towards you and you feel a horrible rending pain deep within you!", ch, 0, victim, TO_VICT);
	act("$n extends a hand towards $N, who lurches in agony despite no visible injury!", ch, 0, victim, TO_NOTVICT);

	damage_new(ch, victim, dam, sn, DAM_INTERNAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "crushing force");
}